

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_includes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  int iVar2;
  BOOL BVar3;
  JSValueUnion JVar4;
  int64_t idx;
  JSValueUnion JVar5;
  JSValue *countp;
  int64_t *piVar6;
  JSValue v;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValueUnion JStackY_70;
  uint32_t count;
  JSValueUnion local_58;
  long local_50;
  int64_t local_48;
  JSValue *arrp;
  int64_t len;
  
  countp = argv;
  JVar7 = JS_ToObject(ctx,this_val);
  JVar4 = JVar7.u;
  iVar2 = js_get_length64(ctx,&len,JVar7);
  JStackY_70.float64 = 2.96439387504748e-323;
  if (iVar2 == 0) {
    local_50 = len;
    if (0 < len) {
      local_48 = 0;
      if (1 < argc) {
        JVar5.float64 = 0.0;
        countp = (JSValue *)0x0;
        iVar2 = JS_ToInt64Clamp(ctx,&local_48,argv[1],0,len,len);
        if (iVar2 != 0) goto LAB_00128bac;
      }
      idx = local_48;
      JVar8.tag = (int64_t)&arrp;
      JVar8.u.ptr = JVar7.tag;
      BVar3 = js_get_fast_array((JSContext *)JVar4.ptr,JVar8,(JSValue **)&count,(uint32_t *)countp);
      if (BVar3 != 0) {
        piVar6 = &arrp[idx].tag;
        local_58 = JVar4;
        for (; JVar4 = local_58, idx < (long)(ulong)count; idx = idx + 1) {
          JVar8 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          JVar4 = (JSValueUnion)((JSValueUnion *)(piVar6 + -1))->ptr;
          iVar1 = *piVar6;
          if (0xfffffff4 < (uint)iVar1) {
            *(int *)JVar4.ptr = *JVar4.ptr + 1;
          }
          JVar10.tag = iVar1;
          JVar10.u.ptr = JVar4.ptr;
          BVar3 = js_strict_eq2(ctx,JVar8,JVar10,JS_EQ_SAME_VALUE_ZERO);
          if (BVar3 != 0) {
            JVar5.float64 = 4.94065645841247e-324;
            JStackY_70.float64 = JVar5.float64;
            JVar4 = local_58;
            goto LAB_00128bac;
          }
          piVar6 = piVar6 + 2;
        }
      }
      JVar5.float64 = 4.94065645841247e-324;
      do {
        JStackY_70.float64 = JVar5.float64;
        if (local_50 <= idx) goto LAB_00128baa;
        JVar7.u.ptr = JVar4.ptr;
        JVar8 = JS_GetPropertyInt64(ctx,JVar7,idx);
        if ((int)JVar8.tag == 6) {
          JStackY_70.float64 = 2.96439387504748e-323;
          goto LAB_00128baa;
        }
        JVar10 = *argv;
        if (0xfffffff4 < (uint)argv->tag) {
          *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
        }
        BVar3 = js_strict_eq2(ctx,JVar10,JVar8,JS_EQ_SAME_VALUE_ZERO);
        idx = idx + 1;
      } while (BVar3 == 0);
      goto LAB_00128bac;
    }
    JStackY_70.float64 = 4.94065645841247e-324;
  }
LAB_00128baa:
  JVar5.float64 = 0.0;
LAB_00128bac:
  v.tag = (int64_t)JVar7.tag;
  v.u.ptr = JVar4.ptr;
  JS_FreeValue(ctx,v);
  JVar9.tag = (int64_t)JStackY_70.ptr;
  JVar9.u.float64 = JVar5.float64;
  return JVar9;
}

Assistant:

static JSValue js_array_includes(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = FALSE;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]),
                                  JS_EQ_SAME_VALUE_ZERO)) {
                    res = TRUE;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            val = JS_GetPropertyInt64(ctx, obj, n);
            if (JS_IsException(val))
                goto exception;
            if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val,
                              JS_EQ_SAME_VALUE_ZERO)) {
                res = TRUE;
                break;
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}